

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  ImDrawCmd *pIVar1;
  long lVar2;
  ImDrawCmd *pIVar3;
  
  lVar2 = (long)(this->CmdBuffer).Size;
  if (lVar2 != 0) {
    pIVar1 = (this->CmdBuffer).Data;
    pIVar3 = pIVar1 + lVar2 + -1;
    if (((pIVar3 != (ImDrawCmd *)0x0) && (pIVar3->ElemCount == 0)) &&
       (pIVar1[lVar2 + -1].UserCallback == (ImDrawCallback)0x0)) goto LAB_00126c55;
  }
  AddDrawCmd(this);
  pIVar3 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
LAB_00126c55:
  pIVar3->UserCallback = callback;
  pIVar3->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}